

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O2

database_binder *
sqlite::operator<<(database_binder *db,
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *val)

{
  sqlite3_stmt *stmt;
  int inx;
  undefined8 extraout_RAX;
  char *in_RCX;
  str_ref sql;
  int result;
  int local_3c;
  string local_38;
  
  stmt = (db->_stmt)._M_t.super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
         super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
         super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl;
  inx = database_binder::_next_index(db);
  local_3c = bind_col_in_db<std::__cxx11::string>(stmt,inx,val);
  if (local_3c == 0) {
    return db;
  }
  database_binder::sql_abi_cxx11_(&local_38,db);
  sql._M_str = in_RCX;
  sql._M_len = (size_t)local_38._M_dataplus._M_p;
  errors::throw_sqlite_error((errors *)&local_3c,(int *)local_38._M_string_length,sql);
  std::__cxx11::string::~string((string *)&local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

database_binder &operator<<(database_binder& db, T&& val) {
		int result = bind_col_in_db(db._stmt.get(), db._next_index(), std::forward<T>(val));
		if(result != SQLITE_OK)
			exceptions::throw_sqlite_error(result, db.sql());
		return db;
	}